

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O2

void makeInput(int id,string *str)

{
  Value *pVVar1;
  Value *this;
  Value *pVVar2;
  size_t in_RCX;
  int iVar3;
  Value input;
  undefined1 local_2d0 [32];
  FastWriter writer;
  Value local_280;
  Value local_258;
  ofstream fin;
  
  std::ofstream::ofstream(&fin,(string *)str,_S_out);
  Json::FastWriter::FastWriter(&writer);
  Json::Value::Value(&input,nullValue);
  pVVar1 = Json::Value::operator[](&input,"requests");
  this = Json::Value::operator[](&input,"responses");
  iVar3 = 1;
  while( true ) {
    if (turnID < iVar3) break;
    pVVar2 = Json::Value::operator[](&logger,iVar3 + -1);
    pVVar2 = Json::Value::operator[](pVVar2,id);
    Json::Value::Value(&local_258,pVVar2);
    pVVar2 = Json::Value::operator[](pVVar1,iVar3 + -1);
    Json::Value::operator=(pVVar2,&local_258);
    Json::Value::~Value(&local_258);
    iVar3 = iVar3 + 1;
  }
  for (iVar3 = 1; iVar3 < turnID; iVar3 = iVar3 + 1) {
    pVVar1 = Json::Value::operator[](&logger,iVar3);
    pVVar1 = Json::Value::operator[](pVVar1,1 - id);
    Json::Value::Value(&local_280,pVVar1);
    pVVar1 = Json::Value::operator[](this,iVar3 + -1);
    Json::Value::operator=(pVVar1,&local_280);
    Json::Value::~Value(&local_280);
  }
  Json::FastWriter::write_abi_cxx11_((FastWriter *)local_2d0,(int)&writer,&input,in_RCX);
  std::operator<<((ostream *)&fin,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::ofstream::close();
  Json::Value::~Value(&input);
  Json::FastWriter::~FastWriter(&writer);
  std::ofstream::~ofstream(&fin);
  return;
}

Assistant:

void makeInput(int id, string str)
{
    ofstream fin(str);
    Json::FastWriter writer;
    Json::Value input;
    Json::Value &req = input["requests"];
    Json::Value &res = input["responses"];
    for (int i = 1; i <= turnID; ++i)
        req[i - 1] = logger[i - 1][id];
    for (int i = 1; i < turnID; ++i)
        res[i - 1] = logger[i][1 - id];
    fin << writer.write(input);
    fin.close();
}